

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O3

void CB_EXPLORE::predict_or_learn_cover<true>(cb_explore *data,single_learner *base,example *ec)

{
  label *this;
  label *ld;
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  learner<CB_EXPLORE::cb_explore,_example> *plVar5;
  float *pfVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  label_t lVar12;
  wclass *pwVar13;
  size_t sVar14;
  long lVar15;
  cb_class *pcVar16;
  ulong uVar17;
  uint *puVar18;
  uint32_t uVar19;
  uint uVar20;
  uint *puVar21;
  wclass *pwVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 in_XMM3_Db;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  action_scores probs;
  wclass local_68;
  v_array<ACTION_SCORE::action_score> local_58;
  
  uVar20 = (data->cbcs).num_actions;
  uVar25 = (ulong)uVar20;
  local_58._begin = (action_score *)(ec->pred).scalars._begin;
  local_58._end = (action_score *)(ec->pred).scalars._end;
  local_58.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  pwVar22 = (wclass *)base;
  v_array<ACTION_SCORE::action_score>::clear(&local_58);
  this = &data->cs_label;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  if (uVar25 != 0) {
    uVar19 = 1;
    do {
      local_68.x = 3.4028235e+38;
      local_68.partial_prediction = 0.0;
      local_68.wap_value = 0.0;
      pwVar22 = &local_68;
      local_68.class_index = uVar19;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_68);
      iVar24 = (1 - uVar20) + uVar19;
      uVar19 = uVar19 + 1;
    } while (iVar24 != 1);
  }
  uVar4 = data->cover_size;
  lVar15 = data->counter * uVar25;
  ld = &data->cb_label;
  lVar12 = (ec->l).multi;
  pcVar16 = (cb_class *)(ec->l).cs.costs._end;
  sVar14 = (ec->l).cs.costs.erase_count;
  (data->cb_label).costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  (data->cb_label).costs.erase_count = sVar14;
  (data->cb_label).costs._begin = (cb_class *)lVar12;
  (data->cb_label).costs._end = pcVar16;
  lVar12 = (label_t)(this->costs)._begin;
  pwVar13 = (data->cs_label).costs._end;
  sVar14 = (data->cs_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (data->cs_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar14;
  (ec->l).multi = lVar12;
  (ec->l).cs.costs._end = pwVar13;
  get_cover_probabilities(data,(single_learner *)pwVar22,ec,&local_58);
  fVar28 = *(float *)&(data->cb_label).costs._begin;
  fVar29 = *(float *)((long)&(data->cb_label).costs._begin + 4);
  fVar31 = *(float *)&(data->cb_label).costs._end;
  uVar9 = *(undefined4 *)((long)&(data->cb_label).costs._end + 4);
  uVar10 = *(undefined4 *)((long)&(data->cb_label).costs.end_array + 4);
  sVar14 = (data->cb_label).costs.erase_count;
  uVar11 = *(undefined4 *)((long)&(data->cb_label).costs.erase_count + 4);
  *(undefined4 *)((long)&ec->l + 0x10) = *(undefined4 *)&(data->cb_label).costs.end_array;
  *(undefined4 *)((long)&ec->l + 0x14) = uVar10;
  *(int *)((long)&ec->l + 0x18) = (int)sVar14;
  *(undefined4 *)((long)&ec->l + 0x1c) = uVar11;
  (ec->l).simple.label = fVar28;
  (ec->l).simple.weight = fVar29;
  (ec->l).simple.initial = fVar31;
  *(undefined4 *)((long)&ec->l + 0xc) = uVar9;
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  lVar12 = (label_t)(data->cb_label).costs._begin;
  pcVar16 = (data->cb_label).costs._end;
  sVar14 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar14;
  (ec->l).multi = lVar12;
  (ec->l).cs.costs._end = (wclass *)pcVar16;
  pcVar16 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar16;
  GEN_CS::gen_cs_example<false>(&data->cbcs,ec,ld,this);
  if (uVar25 != 0) {
    uVar17 = 0;
    do {
      (data->cover_probs)._begin[uVar17] = 0.0;
      uVar17 = uVar17 + 1;
    } while (uVar25 != uVar17);
  }
  lVar12 = (label_t)(data->second_cs_label).costs._begin;
  pwVar22 = (data->second_cs_label).costs._end;
  sVar14 = (data->second_cs_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (data->second_cs_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar14;
  (ec->l).multi = lVar12;
  (ec->l).cs.costs._end = pwVar22;
  if (uVar4 != 0) {
    dVar8 = SQRT(((double)CONCAT44(0x45300000,(int)((ulong)lVar15 >> 0x20)) - 1.9342813113834067e+25
                 ) + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0));
    auVar7._4_4_ = (float)uVar25;
    auVar7._0_4_ = (float)dVar8;
    auVar7._8_4_ = (int)((ulong)dVar8 >> 0x20);
    auVar7._12_4_ = in_XMM3_Db;
    auVar30 = divps(_DAT_002b0960,auVar7);
    if (auVar30._4_4_ <= auVar30._0_4_) {
      auVar30._0_4_ = auVar30._4_4_;
    }
    fVar31 = 1.0 / (float)uVar4;
    fVar29 = auVar30._0_4_;
    fVar28 = (float)uVar25 * fVar29;
    uVar17 = 0;
    do {
      if (uVar25 != 0) {
        uVar19 = 1;
        lVar15 = 0;
        do {
          fVar26 = (&((data->cs_label).costs._begin)->x)[lVar15];
          fVar2 = data->psi;
          fVar3 = *(float *)((long)(data->cover_probs)._begin + lVar15);
          fVar27 = fVar29;
          if (fVar29 <= fVar3) {
            fVar27 = fVar3;
          }
          (&((data->second_cs_label).costs._begin)->class_index)[lVar15] = uVar19;
          (&((data->second_cs_label).costs._begin)->x)[lVar15] =
               (fVar26 - (fVar2 * fVar29) / (fVar27 / fVar28)) + 1.0;
          lVar15 = lVar15 + 4;
          uVar19 = uVar19 + 1;
        } while (uVar25 * 4 - lVar15 != 0);
      }
      if (uVar17 == 0) {
        puVar18 = (data->preds)._begin;
        puVar21 = puVar18;
      }
      else {
        plVar5 = data->cs;
        iVar24 = (int)uVar17 + 1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(plVar5 + 0xe0) * iVar24);
        (**(code **)(plVar5 + 0x28))
                  (*(undefined8 *)(plVar5 + 0x18),*(undefined8 *)(plVar5 + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar24 * *(int *)(plVar5 + 0xe0));
        puVar21 = (data->preds)._begin;
        puVar18 = puVar21 + uVar17;
      }
      pfVar6 = (data->cover_probs)._begin;
      uVar20 = puVar21[uVar17] - 1;
      fVar26 = fVar31;
      if (pfVar6[*puVar18 - 1] <= fVar29 && fVar29 != pfVar6[*puVar18 - 1]) {
        fVar26 = (pfVar6[uVar20] - fVar29) + fVar31;
        uVar23 = (ulong)fVar26;
        uVar23 = (long)(fVar26 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23;
        if ((long)uVar23 < 0) {
          fVar26 = (float)uVar23;
        }
        else {
          fVar26 = (float)(long)uVar23;
        }
      }
      fVar28 = fVar28 + fVar26;
      pfVar6[uVar20] = pfVar6[uVar20] + fVar31;
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar4);
  }
  lVar12 = (label_t)(ld->costs)._begin;
  pcVar16 = (data->cb_label).costs._end;
  sVar14 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar14;
  (ec->l).multi = lVar12;
  (ec->l).cs.costs._end = (wclass *)pcVar16;
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = (float *)local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}